

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

int __thiscall File::open(File *this,char *__file,int __oflag,...)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  enable_if_t<is_constructible_v<std::basic_filebuf<char>_>_&&___exactly_once<std::basic_filebuf<char>_>,_std::basic_filebuf<char>_&>
  this_00;
  _If_fs_path<std::filesystem::__cxx11::path,___filebuf_type_*> pbVar3;
  File *local_80;
  basic_streambuf<char,_std::char_traits<char>_> *local_60;
  basic_streambuf<char,_std::char_traits<char>_> *local_58;
  path local_50;
  _Ios_Openmode local_24;
  path *ppStack_20;
  openmode mode_local;
  path *path_local;
  File *this_local;
  
  local_24 = __oflag;
  ppStack_20 = (path *)__file;
  path_local = (path *)this;
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (&local_50,(char (*) [2])"-",auto_format);
  bVar1 = std::filesystem::__cxx11::operator==((path *)__file,&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    _Var2 = std::operator&(local_24,_S_in);
    this_local = this;
    if (_Var2 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      _Var2 = std::operator&(local_24,_S_out);
      if (_Var2 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
        __assert_fail("mode & std::ios_base::out",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/file.hpp"
                      ,0x38,"open");
      }
      local_60 = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
      std::variant<std::streambuf*,std::filebuf>::emplace<std::streambuf*,std::streambuf*>
                ((variant<std::streambuf*,std::filebuf> *)this,&local_60);
    }
    else {
      _Var2 = std::operator&(local_24,_S_out);
      if (_Var2 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
        __assert_fail("!(mode & std::ios_base::out)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/file.hpp"
                      ,0x31,"open");
      }
      local_58 = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
      std::variant<std::streambuf*,std::filebuf>::emplace<std::streambuf*,std::streambuf*>
                ((variant<std::streambuf*,std::filebuf> *)this,&local_58);
    }
  }
  else {
    this_00 = std::variant<std::streambuf*,std::filebuf>::emplace<std::filebuf>
                        ((variant<std::streambuf*,std::filebuf> *)this);
    pbVar3 = std::basic_filebuf<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                       (this_00,ppStack_20,local_24);
    local_80 = this;
    if (pbVar3 == (_If_fs_path<std::filesystem::__cxx11::path,___filebuf_type_*>)0x0) {
      local_80 = (File *)0x0;
    }
    this_local = local_80;
  }
  return (int)this_local;
}

Assistant:

File *open(std::filesystem::path const &path, std::ios_base::openmode mode) {
		if (path != "-") {
			return _file.emplace<std::filebuf>().open(path, mode) ? this : nullptr;
		} else if (mode & std::ios_base::in) {
			assert(!(mode & std::ios_base::out));
			_file.emplace<std::streambuf *>(std::cin.rdbuf());
			if (setmode(STDIN_FILENO, mode & std::ios_base::binary ? O_BINARY : O_TEXT) == -1) {
				fatal("Failed to set stdin to %s mode: %s",
				      mode & std::ios_base::binary ? "binary" : "text", strerror(errno));
			}
		} else {
			assert(mode & std::ios_base::out);
			_file.emplace<std::streambuf *>(std::cout.rdbuf());
		}
		return this;
	}